

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O2

string_view absl::FindLongestCommonSuffix(string_view a,string_view b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  string_view sVar8;
  
  uVar5 = a._M_len;
  uVar3 = b._M_len;
  uVar1 = uVar5;
  if (uVar3 < uVar5) {
    uVar1 = uVar3;
  }
  if (uVar1 == 0) {
    uVar3 = 0;
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar4 = b._M_str + uVar3;
    uVar2 = 0;
    pcVar7 = a._M_str + uVar5;
    while ((pcVar4 = pcVar4 + -1, uVar3 = uVar1, pcVar6 = a._M_str + (uVar5 - uVar1), uVar1 != uVar2
           && (uVar3 = uVar2, pcVar6 = pcVar7, pcVar7[-1] == *pcVar4))) {
      uVar2 = uVar2 + 1;
      pcVar7 = pcVar7 + -1;
    }
  }
  sVar8._M_str = pcVar6;
  sVar8._M_len = uVar3;
  return sVar8;
}

Assistant:

absl::string_view FindLongestCommonSuffix(absl::string_view a,
                                          absl::string_view b) {
  const absl::string_view::size_type limit = std::min(a.size(), b.size());
  if (limit == 0) return absl::string_view();

  const char* pa = a.data() + a.size() - 1;
  const char* pb = b.data() + b.size() - 1;
  absl::string_view::size_type count = (unsigned) 0;
  while (count < limit && *pa == *pb) {
    --pa;
    --pb;
    ++count;
  }

  return absl::string_view(++pa, count);
}